

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall crnlib::dxt_hc::~dxt_hc(dxt_hc *this)

{
  color_quad<unsigned_char,_int> *pcVar1;
  void *pvVar2;
  selector_indices_details *p;
  endpoint_indices_details *p_00;
  uint *puVar3;
  bool *pbVar4;
  unsigned_long_long *p_01;
  uchar *p_02;
  float *p_03;
  ulong uVar5;
  long lVar6;
  alpha_cluster *p_04;
  color_cluster *p_05;
  tile_details *p_06;
  color_cluster *q;
  alpha_cluster *paVar7;
  color_cluster *pcVar8;
  
  p_04 = (this->m_alpha_clusters).m_p;
  if (p_04 != (alpha_cluster *)0x0) {
    uVar5 = (ulong)(this->m_alpha_clusters).m_size;
    if (uVar5 != 0) {
      paVar7 = p_04 + uVar5;
      do {
        pcVar1 = (p_04->pixels).m_p;
        if (pcVar1 != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(pcVar1);
        }
        lVar6 = 0x30;
        do {
          pvVar2 = *(void **)((long)(p_04->blocks + -1) + lVar6);
          if (pvVar2 != (void *)0x0) {
            crnlib_free(pvVar2);
          }
          lVar6 = lVar6 + -0x10;
        } while (lVar6 != 0);
        p_04 = p_04 + 1;
      } while (p_04 != paVar7);
      p_04 = (this->m_alpha_clusters).m_p;
    }
    crnlib_free(p_04);
  }
  p_05 = (this->m_color_clusters).m_p;
  if (p_05 != (color_cluster *)0x0) {
    uVar5 = (ulong)(this->m_color_clusters).m_size;
    if (uVar5 != 0) {
      pcVar8 = p_05 + uVar5;
      do {
        pcVar1 = (p_05->pixels).m_p;
        if (pcVar1 != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(pcVar1);
        }
        lVar6 = 0x30;
        do {
          pvVar2 = *(void **)((long)(p_05->blocks + -1) + lVar6);
          if (pvVar2 != (void *)0x0) {
            crnlib_free(pvVar2);
          }
          lVar6 = lVar6 + -0x10;
        } while (lVar6 != 0);
        p_05 = p_05 + 1;
      } while (p_05 != pcVar8);
      p_05 = (this->m_color_clusters).m_p;
    }
    crnlib_free(p_05);
  }
  p = (this->m_selector_indices).m_p;
  if (p != (selector_indices_details *)0x0) {
    crnlib_free(p);
  }
  p_00 = (this->m_endpoint_indices).m_p;
  if (p_00 != (endpoint_indices_details *)0x0) {
    crnlib_free(p_00);
  }
  puVar3 = (this->m_tile_indices).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
  }
  pbVar4 = (this->m_alpha_selectors_used).m_p;
  if (pbVar4 != (bool *)0x0) {
    crnlib_free(pbVar4);
  }
  pbVar4 = (this->m_color_selectors_used).m_p;
  if (pbVar4 != (bool *)0x0) {
    crnlib_free(pbVar4);
  }
  p_01 = (this->m_alpha_selectors).m_p;
  if (p_01 != (unsigned_long_long *)0x0) {
    crnlib_free(p_01);
  }
  puVar3 = (this->m_color_selectors).m_p;
  if (puVar3 != (uint *)0x0) {
    crnlib_free(puVar3);
  }
  lVar6 = 0x688;
  do {
    pvVar2 = *(void **)((long)(this->m_color_derating + -1) + 0xc + lVar6);
    if (pvVar2 != (void *)0x0) {
      crnlib_free(pvVar2);
    }
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 0x658);
  p_02 = (this->m_block_encodings).m_p;
  if (p_02 != (uchar *)0x0) {
    crnlib_free(p_02);
  }
  p_03 = (this->m_block_weights).m_p;
  if (p_03 != (float *)0x0) {
    crnlib_free(p_03);
  }
  p_06 = (this->m_tiles).m_p;
  if (p_06 != (tile_details *)0x0) {
    uVar5 = (ulong)(this->m_tiles).m_size;
    if (uVar5 != 0) {
      lVar6 = 0;
      do {
        pvVar2 = *(void **)((long)(p_06->color_endpoint).m_s + lVar6 + -0x14);
        if (pvVar2 != (void *)0x0) {
          crnlib_free(pvVar2);
        }
        lVar6 = lVar6 + 0x48;
      } while (uVar5 * 0x48 != lVar6);
      p_06 = (this->m_tiles).m_p;
    }
    crnlib_free(p_06);
  }
  return;
}

Assistant:

dxt_hc::~dxt_hc()
    {
    }